

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void __thiscall AngleSet::computeStartEndTheta(AngleSet *this,double *sTheta,double *eTheta)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  double len;
  double end;
  double start;
  double biggestGapLength;
  double biggestGapEtheta;
  double biggestGapSTheta;
  int nextArc;
  int current;
  double *eTheta_local;
  double *sTheta_local;
  AngleSet *this_local;
  
  if (this->angles[this->head].next < 0) {
    *sTheta = this->angles[this->head].sTheta;
    *eTheta = this->angles[this->head].eTheta;
  }
  else {
    biggestGapSTheta._0_4_ = this->angles[this->head].next;
    biggestGapEtheta = this->angles[this->head].eTheta;
    biggestGapLength = this->angles[biggestGapSTheta._0_4_].sTheta;
    start = biggestGapLength - biggestGapEtheta;
    while (iVar3 = this->angles[biggestGapSTheta._0_4_].next, -1 < iVar3) {
      dVar1 = this->angles[biggestGapSTheta._0_4_].eTheta;
      dVar2 = this->angles[iVar3].sTheta;
      dVar4 = dVar2 - dVar1;
      biggestGapSTheta._0_4_ = iVar3;
      if (start < dVar4) {
        start = dVar4;
        biggestGapLength = dVar2;
        biggestGapEtheta = dVar1;
      }
    }
    dVar1 = this->angles[biggestGapSTheta._0_4_].eTheta;
    dVar2 = this->angles[this->head].sTheta;
    if (start < (6.283185307179586 - dVar1) + dVar2) {
      biggestGapLength = dVar2;
      biggestGapEtheta = dVar1;
    }
    *sTheta = biggestGapLength;
    *eTheta = biggestGapEtheta;
  }
  return;
}

Assistant:

void AngleSet::computeStartEndTheta(double & sTheta, double & eTheta)
{
	// Special case: Just one arc
	if (angles[head].next < 0) {
		sTheta = angles[head].sTheta;
		eTheta = angles[head].eTheta;

		return;
	} //end-if

	  // OK. More than one arc. Find the biggest gap
	int current = head;
	int nextArc = angles[current].next;

	double biggestGapSTheta = angles[current].eTheta;
	double biggestGapEtheta = angles[nextArc].sTheta;
	double biggestGapLength = biggestGapEtheta - biggestGapSTheta;

	double start, end, len;
	while (1) {
		current = nextArc;
		nextArc = angles[nextArc].next;
		if (nextArc < 0) break;

		start = angles[current].eTheta;
		end = angles[nextArc].sTheta;
		len = end - start;

		if (len > biggestGapLength) {
			biggestGapSTheta = start;
			biggestGapEtheta = end;
			biggestGapLength = len;
		} //end-if

	} //end-while

	  // Compute the gap between the last arc & the first arc
	start = angles[current].eTheta;
	end = angles[head].sTheta;
	len = TWOPI - start + end;
	if (len > biggestGapLength) {
		biggestGapSTheta = start;
		biggestGapEtheta = end;
	} //end-if

	sTheta = biggestGapEtheta;
	eTheta = biggestGapSTheta;
}